

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

uECC_word_t
EccPoint_compute_public_key(uECC_word_t *result,uECC_word_t *private_key,uECC_Curve curve)

{
  int iVar1;
  uECC_word_t uVar2;
  uECC_word_t *random;
  uECC_word_t *p2 [2];
  uECC_word_t tmp2 [4];
  uECC_word_t tmp1 [4];
  uECC_word_t *local_78 [2];
  uECC_word_t local_68 [4];
  uECC_word_t local_48 [5];
  
  local_78[0] = local_48;
  local_78[1] = local_68;
  uVar2 = regularize_k(private_key,local_78[0],local_78[1],curve);
  if (g_rng_function == (uECC_RNG_Function)0x0) {
    random = (uECC_word_t *)0x0;
  }
  else {
    random = local_78[uVar2];
    iVar1 = uECC_generate_random_int(random,curve->p,curve->num_words);
    if (iVar1 == 0) {
      return 0;
    }
  }
  EccPoint_mult(result,curve->G,local_78[uVar2 ^ 1],random,curve->num_n_bits + 1,curve);
  uVar2 = uECC_vli_isZero(result,curve->num_words * '\x02');
  return uVar2 ^ 1;
}

Assistant:

static uECC_word_t EccPoint_compute_public_key(uECC_word_t *result,
                                               uECC_word_t *private_key,
                                               uECC_Curve curve) {
    uECC_word_t tmp1[uECC_MAX_WORDS];
    uECC_word_t tmp2[uECC_MAX_WORDS];
    uECC_word_t *p2[2] = {tmp1, tmp2};
    uECC_word_t *initial_Z = 0;
    uECC_word_t carry;

    /* Regularize the bitcount for the private key so that attackers cannot use a side channel
       attack to learn the number of leading zeros. */
    carry = regularize_k(private_key, tmp1, tmp2, curve);

    /* If an RNG function was specified, try to get a random initial Z value to improve
       protection against side-channel attacks. */
    if (g_rng_function) {
        if (!uECC_generate_random_int(p2[carry], curve->p, curve->num_words)) {
            return 0;
        }
        initial_Z = p2[carry];
    }
    EccPoint_mult(result, curve->G, p2[!carry], initial_Z, curve->num_n_bits + 1, curve);

    if (EccPoint_isZero(result, curve)) {
        return 0;
    }
    return 1;
}